

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomElementPrivate * __thiscall
QDomDocumentPrivate::createElementNS(QDomDocumentPrivate *this,QString *nsURI,QString *qName)

{
  QAtomicInt *pQVar1;
  QDomElementPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  bool ok;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ok = true;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  fixedXmlName((QString *)&local_48,qName,&ok,true);
  if (ok == true) {
    this_00 = (QDomElementPrivate *)operator_new(0xb0);
    QDomElementPrivate::QDomElementPrivate
              (this_00,this,(QDomNodePrivate *)0x0,nsURI,(QString *)&local_48);
    LOCK();
    pQVar1 = &(this_00->super_QDomNodePrivate).ref;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  else {
    this_00 = (QDomElementPrivate *)0x0;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDomElementPrivate* QDomDocumentPrivate::createElementNS(const QString &nsURI, const QString &qName)
{
    bool ok;
    QString fixedName = fixedXmlName(qName, &ok, true);
    if (!ok)
        return nullptr;

    QDomElementPrivate *e = new QDomElementPrivate(this, nullptr, nsURI, fixedName);
    e->ref.deref();
    return e;
}